

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# two_level_iterator.cc
# Opt level: O3

Status __thiscall leveldb::anon_unknown_6::TwoLevelIterator::status(TwoLevelIterator *this)

{
  Iterator *in_RAX;
  _func_int **pp_Var1;
  long in_RSI;
  Iterator *local_28;
  
  local_28 = in_RAX;
  IteratorWrapper::status((IteratorWrapper *)&local_28);
  if (local_28 == (Iterator *)0x0) {
    if (*(long *)(in_RSI + 0x70) != 0) {
      IteratorWrapper::status((IteratorWrapper *)&local_28);
      if (local_28 != (Iterator *)0x0) goto LAB_0011cd4b;
    }
    if (*(char **)(in_RSI + 0x48) == (char *)0x0) {
      pp_Var1 = (_func_int **)0x0;
    }
    else {
      pp_Var1 = (_func_int **)Status::CopyState(*(char **)(in_RSI + 0x48));
    }
    (this->super_Iterator)._vptr_Iterator = pp_Var1;
  }
  else {
LAB_0011cd4b:
    operator_delete__(local_28);
    IteratorWrapper::status((IteratorWrapper *)this);
  }
  return (Status)(char *)this;
}

Assistant:

Status status() const override {
    // It'd be nice if status() returned a const Status& instead of a Status
    if (!index_iter_.status().ok()) {
      return index_iter_.status();
    } else if (data_iter_.iter() != nullptr && !data_iter_.status().ok()) {
      return data_iter_.status();
    } else {
      return status_;
    }
  }